

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBase * ParsePostExpressions(ParseContext *ctx,SynBase *node)

{
  LexemeType LVar1;
  SynBase *pSVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  SynBase *pSVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Lexeme *pLVar7;
  undefined4 extraout_var_01;
  SynArrayIndex *pSVar8;
  undefined4 extraout_var_03;
  Lexeme *pLVar9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  char *msg;
  InplaceStr name;
  IntrusiveList<SynCallArgument> IVar10;
  bool shrBorrow;
  IntrusiveList<SynBase> aliases;
  undefined4 extraout_var_02;
  
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          pLVar7 = ctx->currentLexeme;
          LVar1 = pLVar7->type;
          if (LVar1 != lex_point) break;
          ctx->currentLexeme = pLVar7 + 1;
          if ((pLVar7[1].type == lex_return) ||
             (bVar3 = anon_unknown.dwarf_1519a::CheckAt
                                (ctx,lex_string,"ERROR: member name expected after \'.\'"), bVar3))
          {
            name = ParseContext::Consume(ctx);
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            pLVar7 = ParseContext::Previous(ctx);
            pLVar9 = ParseContext::Previous(ctx);
            SynIdentifier::SynIdentifier
                      ((SynIdentifier *)CONCAT44(extraout_var_00,iVar5),pLVar7,pLVar9,name);
            iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            pLVar7 = (((SynArrayIndex *)node)->super_SynBase).begin;
            pLVar9 = ParseContext::Previous(ctx);
            SynMemberAccess::SynMemberAccess
                      ((SynMemberAccess *)CONCAT44(extraout_var_01,iVar4),pLVar7,pLVar9,node,
                       (SynIdentifier *)CONCAT44(extraout_var_00,iVar5));
            node = (SynBase *)CONCAT44(extraout_var_01,iVar4);
          }
          else {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            pLVar7 = ParseContext::Previous(ctx);
            pLVar9 = ParseContext::Previous(ctx);
            SynMemberAccess::SynMemberAccess
                      ((SynMemberAccess *)CONCAT44(extraout_var_04,iVar5),pLVar7,pLVar9,node,
                       (SynIdentifier *)0x0);
            node = (SynBase *)CONCAT44(extraout_var_04,iVar5);
          }
        }
        if (LVar1 != lex_oparen) break;
        ctx->currentLexeme = pLVar7 + 1;
        IVar10 = ParseCallArguments(ctx);
        anon_unknown.dwarf_1519a::CheckConsume
                  (ctx,lex_cparen,"ERROR: \')\' not found after function argument list");
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        pSVar8 = (SynArrayIndex *)CONCAT44(extraout_var_02,iVar5);
        pLVar9 = ParseContext::Previous(ctx);
        SynBase::SynBase((SynBase *)pSVar8,0x1a,pLVar7,pLVar9);
        (pSVar8->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002227a0;
        pSVar8->value = node;
        (pSVar8->arguments).head = (SynCallArgument *)0x0;
        (pSVar8->arguments).tail = (SynCallArgument *)0x0;
        *(IntrusiveList<SynCallArgument> *)&pSVar8[1].super_SynBase = IVar10;
        node = (SynBase *)pSVar8;
      }
      if (LVar1 != lex_obracket) break;
      ctx->currentLexeme = pLVar7 + 1;
      IVar10 = ParseCallArguments(ctx);
      anon_unknown.dwarf_1519a::CheckConsume
                (ctx,lex_cbracket,"ERROR: \']\' not found after expression");
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
      pLVar9 = ParseContext::Previous(ctx);
      SynArrayIndex::SynArrayIndex
                ((SynArrayIndex *)CONCAT44(extraout_var,iVar5),pLVar7,pLVar9,node,IVar10);
      node = (SynBase *)CONCAT44(extraout_var,iVar5);
    }
    if (LVar1 != lex_with) {
      if (LVar1 == lex_inc) {
        bVar3 = true;
      }
      else {
        if (LVar1 != lex_dec) {
          return &((SynArrayIndex *)node)->super_SynBase;
        }
        bVar3 = false;
      }
      ctx->currentLexeme = pLVar7 + 1;
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pLVar9 = ParseContext::Previous(ctx);
      SynPostModify::SynPostModify
                ((SynPostModify *)CONCAT44(extraout_var_05,iVar5),pLVar7,pLVar9,node,bVar3);
      return &((SynPostModify *)CONCAT44(extraout_var_05,iVar5))->super_SynBase;
    }
    ctx->currentLexeme = pLVar7 + 1;
    aliases.head = (SynBase *)0x0;
    aliases.tail = (SynBase *)0x0;
    anon_unknown.dwarf_1519a::CheckConsume
              (ctx,lex_less,"ERROR: \'<\' not found before explicit generic type alias list");
    shrBorrow = false;
    while (pSVar6 = ParseType(ctx,&shrBorrow,false), pSVar6 != (SynBase *)0x0) {
      IntrusiveList<SynBase>::push_back(&aliases,pSVar6);
      if (ctx->currentLexeme->type != lex_comma) goto LAB_001117a2;
      ctx->currentLexeme = ctx->currentLexeme + 1;
    }
    msg = "ERROR: type name is expected after \',\'";
    if (aliases.head == (SynBase *)0x0) {
      msg = "ERROR: type name is expected after \'with\'";
    }
    anon_unknown.dwarf_1519a::Report(ctx,ctx->currentLexeme,msg);
LAB_001117a2:
    anon_unknown.dwarf_1519a::CheckConsume
              (ctx,(uint)shrBorrow * 2 + lex_greater,
               "ERROR: \'>\' not found after explicit generic type alias list");
    anon_unknown.dwarf_1519a::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' is expected at this point");
    IVar10 = ParseCallArguments(ctx);
    anon_unknown.dwarf_1519a::CheckConsume
              (ctx,lex_cparen,"ERROR: \')\' not found after function argument list");
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pSVar8 = (SynArrayIndex *)CONCAT44(extraout_var_03,iVar5);
    pLVar9 = ParseContext::Previous(ctx);
    pSVar2 = aliases.tail;
    pSVar6 = aliases.head;
    SynBase::SynBase((SynBase *)pSVar8,0x1a,pLVar7,pLVar9);
    (pSVar8->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002227a0;
    pSVar8->value = node;
    (pSVar8->arguments).head = (SynCallArgument *)pSVar6;
    (pSVar8->arguments).tail = (SynCallArgument *)pSVar2;
    *(IntrusiveList<SynCallArgument> *)&pSVar8[1].super_SynBase = IVar10;
    node = (SynBase *)pSVar8;
  } while( true );
}

Assistant:

SynBase* ParsePostExpressions(ParseContext &ctx, SynBase *node)
{
	while(ctx.At(lex_point) || ctx.At(lex_obracket) || ctx.At(lex_oparen) || ctx.At(lex_with))
	{
		Lexeme *pos = ctx.currentLexeme;

		if(ctx.Consume(lex_point))
		{
			if(ctx.At(lex_return) || CheckAt(ctx, lex_string, "ERROR: member name expected after '.'"))
			{
				InplaceStr member = ctx.Consume();
				SynIdentifier *memberIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), member);

				node = new (ctx.get<SynMemberAccess>()) SynMemberAccess(node->begin, ctx.Previous(), node, memberIdentifier);
			}
			else
			{
				node = new (ctx.get<SynMemberAccess>()) SynMemberAccess(ctx.Previous(), ctx.Previous(), node, NULL);
			}
		}
		else if(ctx.Consume(lex_obracket))
		{
			IntrusiveList<SynCallArgument> arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cbracket, "ERROR: ']' not found after expression");

			node = new (ctx.get<SynArrayIndex>()) SynArrayIndex(pos, ctx.Previous(), node, arguments);
		}
		else if(ctx.Consume(lex_with))
		{
			IntrusiveList<SynBase> aliases;

			CheckConsume(ctx, lex_less, "ERROR: '<' not found before explicit generic type alias list");

			bool shrBorrow = false;

			do
			{
				SynBase *type = ParseType(ctx, &shrBorrow);

				if(!type)
				{
					if(aliases.empty())
						Report(ctx, ctx.Current(), "ERROR: type name is expected after 'with'");
					else
						Report(ctx, ctx.Current(), "ERROR: type name is expected after ','");

					break;
				}

				aliases.push_back(type);
			}
			while(ctx.Consume(lex_comma));

			CheckConsume(ctx, shrBorrow ? lex_shr : lex_greater, "ERROR: '>' not found after explicit generic type alias list");

			CheckConsume(ctx, lex_oparen, "ERROR: '(' is expected at this point");

			IntrusiveList<SynCallArgument> arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function argument list");

			node = new (ctx.get<SynFunctionCall>()) SynFunctionCall(pos, ctx.Previous(), node, aliases, arguments);
		}
		else if(ctx.Consume(lex_oparen))
		{
			IntrusiveList<SynBase> aliases;
			IntrusiveList<SynCallArgument> arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function argument list");

			node = new (ctx.get<SynFunctionCall>()) SynFunctionCall(pos, ctx.Previous(), node, aliases, arguments);
		}
		else
		{
			Stop(ctx, ctx.Current(), "ERROR: not implemented");
		}
	}

	Lexeme *pos = ctx.currentLexeme;

	if(ctx.Consume(lex_inc))
		node = new (ctx.get<SynPostModify>()) SynPostModify(pos, ctx.Previous(), node, true);
	else if(ctx.Consume(lex_dec))
		node = new (ctx.get<SynPostModify>()) SynPostModify(pos, ctx.Previous(), node, false);

	return node;
}